

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
ClearNodeVector(TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
                *this)

{
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}